

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinedH264Demuxer.cpp
# Opt level: O0

void __thiscall CombinedH264Reader::fillPids(CombinedH264Reader *this,PIDSet *acceptedPIDs,int pid)

{
  bool bVar1;
  int iVar2;
  _Self local_40;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  int local_1c;
  PIDSet *pPStack_18;
  int pid_local;
  PIDSet *acceptedPIDs_local;
  CombinedH264Reader *this_local;
  
  local_1c = pid;
  pPStack_18 = acceptedPIDs;
  acceptedPIDs_local = (PIDSet *)this;
  iVar2 = SubTrackFilter::pidToSubPid(pid,1);
  this->m_mvcStreamIndex = iVar2;
  iVar2 = SubTrackFilter::pidToSubPid(local_1c,2);
  this->m_avcStreamIndex = iVar2;
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(pPStack_18,&this->m_mvcStreamIndex)
  ;
  local_30._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(pPStack_18)
  ;
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this->m_mvcStreamIndex = -1;
  }
  local_38._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find(pPStack_18,&this->m_avcStreamIndex)
  ;
  local_40._M_node = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(pPStack_18)
  ;
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    this->m_avcStreamIndex = -1;
  }
  return;
}

Assistant:

void CombinedH264Reader::fillPids(const PIDSet& acceptedPIDs, const int pid)
{
    m_mvcStreamIndex = SubTrackFilter::pidToSubPid(pid, MVC_STREAM_INDEX);
    m_avcStreamIndex = SubTrackFilter::pidToSubPid(pid, AVC_STREAM_INDEX);
    if (acceptedPIDs.find(m_mvcStreamIndex) == acceptedPIDs.end())
        m_mvcStreamIndex = -1;
    if (acceptedPIDs.find(m_avcStreamIndex) == acceptedPIDs.end())
        m_avcStreamIndex = -1;
}